

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O2

void Abc_NtkRecDumpTt3(char *pFileName,int fBinary)

{
  uint nCap;
  int nVars;
  int *__base;
  Lms_Man_t *pLVar1;
  int iVar2;
  FILE *__stream;
  Vec_Str_t *pVVar3;
  word *pwVar4;
  Vec_Int_t *p;
  ulong uVar5;
  char *__s;
  ulong uVar6;
  int iVar7;
  char pBuffer [1000];
  
  pLVar1 = s_pMan3;
  nCap = s_pMan3->vTtMem->nEntries;
  if ((long)(int)nCap == 0) {
    __s = "There is not truth tables.";
  }
  else {
    nVars = s_pMan3->nVars;
    __stream = fopen(pFileName,"wb");
    if (__stream != (FILE *)0x0) {
      pVVar3 = Vec_StrAlloc(nCap);
      pLVar1->vSupps = pVVar3;
      for (iVar7 = 0; iVar7 < pLVar1->vTtMem->nEntries; iVar7 = iVar7 + 1) {
        pwVar4 = Vec_MemReadEntry(pLVar1->vTtMem,iVar7);
        if (pwVar4 == (word *)0x0) break;
        pVVar3 = pLVar1->vSupps;
        iVar2 = Abc_TtSupportSize(pwVar4,nVars);
        Vec_StrPush(pVVar3,(char)iVar2);
      }
      p = Vec_IntAlloc(nCap);
      p->nSize = nCap;
      uVar5 = 0;
      uVar6 = 0;
      if (0 < (int)nCap) {
        uVar6 = (ulong)nCap;
      }
      __base = p->pArray;
      for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
        __base[uVar5] = (int)uVar5;
      }
      qsort(__base,(long)(int)nCap,4,Abc_NtkRecTruthCompare);
      Vec_StrFreeP(&pLVar1->vSupps);
      for (iVar7 = 0; (int)uVar6 != iVar7; iVar7 = iVar7 + 1) {
        iVar2 = Vec_IntEntry(p,iVar7);
        pwVar4 = Vec_MemReadEntry(pLVar1->vTtMem,iVar2);
        if (fBinary == 0) {
          Extra_PrintHex((FILE *)__stream,(uint *)pwVar4,nVars);
          fwrite("  ",2,1,__stream);
          Dau_DsdDecompose(pwVar4,pLVar1->nVars,0,(uint)(nVars < 0xb),pBuffer);
          fprintf(__stream,"%s\n",pBuffer);
        }
        else {
          fwrite(pwVar4,1,(long)pLVar1->nWords << 3,__stream);
        }
      }
      fclose(__stream);
      Vec_IntFree(p);
      return;
    }
    __s = "The file cannot be opened.";
  }
  puts(__s);
  return;
}

Assistant:

void Abc_NtkRecDumpTt3( char * pFileName, int fBinary )
{
    FILE * pFile;
    char pBuffer[1000];
    Lms_Man_t * p = s_pMan3;
    Vec_Int_t * vEntries;
    word * pTruth;
    int i, Entry, nVars = p->nVars;
    int nEntries = Vec_MemEntryNum(p->vTtMem);
    if ( nEntries == 0 )
    {
        printf( "There is not truth tables.\n" );
        return;
    }
    pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "The file cannot be opened.\n" );
        return;
    }
    p->vSupps = Vec_StrAlloc( nEntries );
    Vec_MemForEachEntry( p->vTtMem, pTruth, i )
        Vec_StrPush( p->vSupps, (char)Abc_TtSupportSize(pTruth, nVars) );
    vEntries = Vec_IntStartNatural( nEntries );
    qsort( (void *)Vec_IntArray(vEntries), (size_t)nEntries, sizeof(int), (int(*)(const void *,const void *))Abc_NtkRecTruthCompare );
    Vec_StrFreeP( &p->vSupps );
    // write the file
    Vec_IntForEachEntry( vEntries, Entry, i )
    {
        pTruth = Vec_MemReadEntry(p->vTtMem, Entry);
        if ( fBinary )
        {
            fwrite( pTruth, 1, sizeof(word) * p->nWords, pFile );
            continue;
        }
        Extra_PrintHex( pFile, (unsigned *)pTruth, nVars );
        fprintf( pFile, "  " );
//        Kit_DsdWriteFromTruth( pBuffer, (unsigned *)pTruth, nVars );
        Dau_DsdDecompose( pTruth, p->nVars, 0, (int)(nVars <= 10), pBuffer );
        fprintf( pFile, "%s\n", pBuffer );
    }
    fclose( pFile );
    Vec_IntFree( vEntries );
}